

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::ShaderCompilerCase::logProgramData
          (ShaderCompilerCase *this,BuildInfo *buildInfo,ProgramContext *progCtx)

{
  bool linkOk;
  TestLog *this_00;
  pointer pcVar1;
  long *local_e0 [2];
  long local_d0 [2];
  LogShader local_c0;
  LogShader local_70;
  
  this_00 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  linkOk = buildInfo->linkSuccess;
  pcVar1 = (buildInfo->logs).link._M_dataplus._M_p;
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e0,pcVar1,pcVar1 + (buildInfo->logs).link._M_string_length);
  tcu::TestLog::startShaderProgram(this_00,linkOk,(char *)local_e0[0]);
  tcu::LogShader::LogShader
            (&local_70,QP_SHADER_TYPE_VERTEX,&progCtx->vertShaderSource,
             buildInfo->vertCompileSuccess,&(buildInfo->logs).vert);
  tcu::TestLog::writeShader
            (this_00,local_70.m_type,local_70.m_source._M_dataplus._M_p,local_70.m_compileOk,
             local_70.m_infoLog._M_dataplus._M_p);
  tcu::LogShader::LogShader
            (&local_c0,QP_SHADER_TYPE_FRAGMENT,&progCtx->fragShaderSource,
             buildInfo->fragCompileSuccess,&(buildInfo->logs).frag);
  tcu::TestLog::writeShader
            (this_00,local_c0.m_type,local_c0.m_source._M_dataplus._M_p,local_c0.m_compileOk,
             local_c0.m_infoLog._M_dataplus._M_p);
  tcu::TestLog::endShaderProgram(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.m_infoLog._M_dataplus._M_p != &local_c0.m_infoLog.field_2) {
    operator_delete(local_c0.m_infoLog._M_dataplus._M_p,
                    local_c0.m_infoLog.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.m_source._M_dataplus._M_p != &local_c0.m_source.field_2) {
    operator_delete(local_c0.m_source._M_dataplus._M_p,
                    local_c0.m_source.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_infoLog._M_dataplus._M_p != &local_70.m_infoLog.field_2) {
    operator_delete(local_70.m_infoLog._M_dataplus._M_p,
                    local_70.m_infoLog.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_source._M_dataplus._M_p != &local_70.m_source.field_2) {
    operator_delete(local_70.m_source._M_dataplus._M_p,
                    local_70.m_source.field_2._M_allocated_capacity + 1);
  }
  if (local_e0[0] != local_d0) {
    operator_delete(local_e0[0],local_d0[0] + 1);
  }
  return;
}

Assistant:

void ShaderCompilerCase::logProgramData (const BuildInfo& buildInfo, const ProgramContext& progCtx) const
{
	m_testCtx.getLog() << TestLog::ShaderProgram(buildInfo.linkSuccess, buildInfo.logs.link)
					   << TestLog::Shader(QP_SHADER_TYPE_VERTEX,	progCtx.vertShaderSource, buildInfo.vertCompileSuccess, buildInfo.logs.vert)
					   << TestLog::Shader(QP_SHADER_TYPE_FRAGMENT,	progCtx.fragShaderSource, buildInfo.fragCompileSuccess, buildInfo.logs.frag)
					   << TestLog::EndShaderProgram;
}